

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LiveTraverser.h
# Opt level: O2

bool __thiscall
glslang::TLiveTraverser::visitSelection(TLiveTraverser *this,TVisit param_1,TIntermSelection *node)

{
  int iVar1;
  undefined4 extraout_var;
  long lVar2;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  bool bVar3;
  undefined4 in_register_00000034;
  
  bVar3 = true;
  if (this->traverseAll == false) {
    iVar1 = (*(node->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x30])
                      (node,CONCAT44(in_register_00000034,param_1));
    lVar2 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x28))
                      ((long *)CONCAT44(extraout_var,iVar1));
    if (lVar2 != 0) {
      if (**(char **)(*(long *)(lVar2 + 0xc0) + 8) == '\x01') {
        iVar1 = (*(node->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x32])(node);
        if (CONCAT44(extraout_var_00,iVar1) != 0) {
          iVar1 = (*(node->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x32])(node);
          (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar1) + 0x10))
                    ((long *)CONCAT44(extraout_var_01,iVar1),this);
        }
      }
      if (**(char **)(*(long *)(lVar2 + 0xc0) + 8) == '\0') {
        iVar1 = (*(node->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x34])(node);
        if (CONCAT44(extraout_var_02,iVar1) != 0) {
          iVar1 = (*(node->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x34])(node);
          (**(code **)(*(long *)CONCAT44(extraout_var_03,iVar1) + 0x10))
                    ((long *)CONCAT44(extraout_var_03,iVar1),this);
        }
      }
      bVar3 = false;
    }
  }
  return bVar3;
}

Assistant:

virtual bool visitSelection(TVisit /* visit */,  TIntermSelection* node)
    {
        if (traverseAll)
            return true; // traverse all code

        TIntermConstantUnion* constant = node->getCondition()->getAsConstantUnion();
        if (constant) {
            // cull the path that is dead
            if (constant->getConstArray()[0].getBConst() == true && node->getTrueBlock())
                node->getTrueBlock()->traverse(this);
            if (constant->getConstArray()[0].getBConst() == false && node->getFalseBlock())
                node->getFalseBlock()->traverse(this);

            return false; // don't traverse any more, we did it all above
        } else
            return true; // traverse the whole subtree
    }